

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MapFieldGenerator::GenerateMembers
          (MapFieldGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  mapped_type *pmVar3;
  Options *pOVar4;
  FieldGeneratorBase *pFVar5;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> local_128;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> value_generator;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> key_generator;
  key_type local_110;
  string local_f0;
  allocator local_c9;
  key_type local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  FieldDescriptor *local_60;
  FieldDescriptor *value_descriptor;
  allocator local_41;
  string local_40;
  FieldDescriptor *local_20;
  FieldDescriptor *key_descriptor;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  key_descriptor = (FieldDescriptor *)printer;
  printer_local = (Printer *)this;
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"key",&local_41);
  pFVar2 = Descriptor::FindFieldByName(pDVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pFVar2;
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"value",&local_81);
  pFVar2 = Descriptor::FindFieldByName(pDVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_60 = pFVar2;
  FieldGeneratorBase::type_name_abi_cxx11_(&local_a8,&this->super_FieldGeneratorBase,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"key_type_name",&local_c9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_FieldGeneratorBase).variables_,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a8);
  FieldGeneratorBase::type_name_abi_cxx11_(&local_f0,&this->super_FieldGeneratorBase,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"value_type_name",(allocator *)((long)&key_generator.ptr_ + 7));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_FieldGeneratorBase).variables_,&local_110);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&key_generator.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_f0);
  pFVar2 = local_20;
  pOVar4 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  pFVar5 = CreateFieldGenerator(pFVar2,1,pOVar4);
  internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
            (&value_generator,pFVar5);
  pFVar2 = local_60;
  pOVar4 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  pFVar5 = CreateFieldGenerator(pFVar2,2,pOVar4);
  internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
            (&local_128,pFVar5);
  io::Printer::Print((Printer *)key_descriptor,&(this->super_FieldGeneratorBase).variables_,
                     "private static readonly pbc::MapField<$key_type_name$, $value_type_name$>.Codec _map_$name$_codec\n    = new pbc::MapField<$key_type_name$, $value_type_name$>.Codec("
                    );
  pFVar5 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::operator->
                     (&value_generator);
  (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar5,key_descriptor);
  io::Printer::Print((Printer *)key_descriptor,", ");
  pFVar5 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::operator->
                     (&local_128);
  (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar5,key_descriptor);
  io::Printer::Print((Printer *)key_descriptor,&(this->super_FieldGeneratorBase).variables_,
                     ", $tag$);\nprivate readonly pbc::MapField<$key_type_name$, $value_type_name$> $name$_ = new pbc::MapField<$key_type_name$, $value_type_name$>();\n"
                    );
  WritePropertyDocComment((Printer *)key_descriptor,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes
            (&this->super_FieldGeneratorBase,(Printer *)key_descriptor);
  io::Printer::Print((Printer *)key_descriptor,&(this->super_FieldGeneratorBase).variables_,
                     "$access_level$ pbc::MapField<$key_type_name$, $value_type_name$> $property_name$ {\n  get { return $name$_; }\n}\n"
                    );
  internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
            (&local_128);
  internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
            (&value_generator);
  return;
}

Assistant:

void MapFieldGenerator::GenerateMembers(io::Printer* printer) {   
  const FieldDescriptor* key_descriptor =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_descriptor =
      descriptor_->message_type()->FindFieldByName("value");
  variables_["key_type_name"] = type_name(key_descriptor);
  variables_["value_type_name"] = type_name(value_descriptor);
  scoped_ptr<FieldGeneratorBase> key_generator(
      CreateFieldGenerator(key_descriptor, 1, this->options()));
  scoped_ptr<FieldGeneratorBase> value_generator(
      CreateFieldGenerator(value_descriptor, 2, this->options()));

  printer->Print(
    variables_,
    "private static readonly pbc::MapField<$key_type_name$, $value_type_name$>.Codec _map_$name$_codec\n"
    "    = new pbc::MapField<$key_type_name$, $value_type_name$>.Codec(");
  key_generator->GenerateCodecCode(printer);
  printer->Print(", ");
  value_generator->GenerateCodecCode(printer);
  printer->Print(
    variables_,
    ", $tag$);\n"
    "private readonly pbc::MapField<$key_type_name$, $value_type_name$> $name$_ = new pbc::MapField<$key_type_name$, $value_type_name$>();\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ pbc::MapField<$key_type_name$, $value_type_name$> $property_name$ {\n"
    "  get { return $name$_; }\n"
    "}\n");
}